

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  type_attribute att;
  unsigned_long i;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"int");
  std::operator<<(poVar1,' ');
  std::operator<<((ostream *)&std::cout,'\n');
  return 0;
}

Assistant:

int
main()
{
    std::cout << myspace::type_name_array_holder::value
                     [type_description_holder::value.type_index]
              << ' ';

    for(auto i = 0ul; i < type_description_holder::value.num_attributes; ++i)
    {
        auto att = type_description_holder::value.attributes[i];
        if(att == shadow::type_attribute::const_tag)
        {
            std::cout << "const ";
        }
        else if(att == shadow::type_attribute::lreference_tag)
        {
            std::cout << "& ";
        }
        else if(att == shadow::type_attribute::pointer_tag)
        {
            std::cout << "* ";
        }
        else
        {
            std::cout << '[' << att << "] ";
        }

    }

    std::cout << '\n';
}